

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5yy_syntax_error(fts5yyParser *fts5yypParser,int fts5yymajor,Fts5Token fts5yyminor)

{
  Fts5Parse *pParse_00;
  uint in_ECX;
  undefined8 in_RDX;
  long in_RDI;
  Fts5Parse *pParse;
  
  pParse_00 = *(Fts5Parse **)(in_RDI + 8);
  sqlite3Fts5ParseError(pParse_00,"fts5: syntax error near \"%.*s\"",(ulong)in_ECX,in_RDX);
  *(Fts5Parse **)(in_RDI + 8) = pParse_00;
  return;
}

Assistant:

static void fts5yy_syntax_error(
  fts5yyParser *fts5yypParser,           /* The parser */
  int fts5yymajor,                   /* The major type of the error token */
  sqlite3Fts5ParserFTS5TOKENTYPE fts5yyminor         /* The minor type of the error token */
){
  sqlite3Fts5ParserARG_FETCH
  sqlite3Fts5ParserCTX_FETCH
#define FTS5TOKEN fts5yyminor
/************ Begin %syntax_error code ****************************************/

  UNUSED_PARAM(fts5yymajor); /* Silence a compiler warning */
  sqlite3Fts5ParseError(
    pParse, "fts5: syntax error near \"%.*s\"",FTS5TOKEN.n,FTS5TOKEN.p
  );
/************ End %syntax_error code ******************************************/
  sqlite3Fts5ParserARG_STORE /* Suppress warning about unused %extra_argument variable */
  sqlite3Fts5ParserCTX_STORE
}